

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  char *replace;
  char local_29a [2];
  undefined1 local_298 [8];
  string reg;
  string key;
  undefined1 local_248 [8];
  RegularExpression regEntry;
  KeyWOW64 param_1_local;
  string *source_local;
  
  regEntry._556_4_ = param_2;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_248,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_248,source);
    if (!bVar1) break;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&reg.field_2 + 8),(RegularExpression *)local_248,1);
    local_29a[1] = 0x5b;
    local_29a[0] = ']';
    cmStrCat<char,std::__cxx11::string&,char>
              ((string *)local_298,local_29a + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&reg.field_2 + 8),local_29a);
    replace = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::ReplaceString(source,replace,"/registry");
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)(reg.field_2._M_local_buf + 8));
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_248);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}